

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::Tscan<unsigned_char>(VM *this)

{
  int iVar1;
  undefined8 in_RAX;
  istream *piVar2;
  undefined8 *puVar3;
  uchar value;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  piVar2 = std::operator>>((istream *)&std::cin,(char *)&local_11);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    ensureStackRest(this,1);
    iVar1 = this->_sp;
    this->_sp = iVar1 + 1;
    (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[iVar1] = (uint)local_11;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00124d30;
  __cxa_throw(puVar3,&IOError::typeinfo,std::exception::~exception);
}

Assistant:

void VM::Tscan() {
    if (T value; std::cin >> value) {
        PUSH(value);
    }
    else {
        throw IOError();
    }
}